

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int elf_open_debugfile_by_debuglink
              (backtrace_state *state,char *filename,char *debuglink_name,uint32_t debuglink_crc,
              backtrace_error_callback error_callback,void *data)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  char *size;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *__dest;
  size_t __n;
  int *piVar8;
  char *__n_00;
  char *pcVar9;
  char *p;
  size_t len;
  undefined1 local_118 [8];
  stat st;
  
  pcVar9 = (char *)0x0;
  pcVar5 = (char *)0x0;
  while( true ) {
    p = pcVar5;
    size = pcVar9;
    iVar1 = lstat(filename,(stat *)local_118);
    if ((iVar1 < 0) || (((uint)st.st_nlink & 0xf000) != 0xa000)) break;
    pcVar9 = (char *)0x80;
    while( true ) {
      pcVar5 = (char *)tcmalloc_backtrace_alloc(state,(size_t)pcVar9,error_callback,data);
      if (pcVar5 == (char *)0x0) goto LAB_0012c15b;
      pcVar6 = (char *)readlink(filename,pcVar5,(size_t)pcVar9);
      if ((long)pcVar6 < 0) {
        tcmalloc_backtrace_free(state,pcVar5,(size_t)pcVar9,error_callback,data);
        goto LAB_0012c15b;
      }
      if (pcVar6 < pcVar9 + -1) break;
      tcmalloc_backtrace_free(state,pcVar5,(size_t)pcVar9,error_callback,data);
      pcVar9 = (char *)((long)pcVar9 * 2);
    }
    pcVar5[(long)pcVar6] = '\0';
    if ((*pcVar5 != '/') && (pcVar6 = strrchr(filename,0x2f), pcVar6 != (char *)0x0)) {
      sVar7 = strlen(pcVar5);
      __dest = (char *)tcmalloc_backtrace_alloc
                                 (state,(size_t)(pcVar6 + (sVar7 - (long)filename) + 2),
                                  error_callback,data);
      if (__dest == (char *)0x0) {
        iVar1 = -1;
        goto LAB_0012c1d5;
      }
      __n_00 = pcVar6 + (1 - (long)filename);
      memcpy(__dest,filename,(size_t)__n_00);
      __n = strlen(pcVar5);
      memcpy(__dest + (long)__n_00,pcVar5,__n);
      (__dest + (long)__n_00)[__n] = '\0';
      tcmalloc_backtrace_free(state,pcVar5,(size_t)pcVar9,error_callback,data);
      pcVar9 = pcVar6 + (sVar7 - (long)filename) + 2;
      pcVar5 = __dest;
    }
    filename = pcVar5;
    if (p != (char *)0x0) {
      tcmalloc_backtrace_free(state,p,(size_t)size,error_callback,data);
    }
  }
LAB_0012c15b:
  pcVar5 = strrchr(filename,0x2f);
  pcVar9 = pcVar5 + (1 - (long)filename);
  if (pcVar5 == (char *)0x0) {
    filename = "";
    pcVar9 = (char *)0x0;
  }
  iVar1 = elf_try_debugfile(state,filename,(size_t)pcVar9,"",0,debuglink_name,error_callback,data);
  if ((iVar1 < 0) &&
     (iVar1 = elf_try_debugfile(state,filename,(size_t)pcVar9,".debug/",7,debuglink_name,
                                error_callback,data), iVar1 < 0)) {
    iVar4 = elf_try_debugfile(state,"/usr/lib/debug/",0xf,filename,(size_t)pcVar9,debuglink_name,
                              error_callback,data);
    iVar1 = -1;
    if (-1 < iVar4) {
      iVar1 = iVar4;
    }
  }
LAB_0012c1d5:
  if ((p != (char *)0x0) && (size != (char *)0x0)) {
    tcmalloc_backtrace_free(state,p,(size_t)size,error_callback,data);
  }
  iVar4 = -1;
  if ((-1 < iVar1) && (iVar4 = iVar1, debuglink_crc != 0)) {
    len = 0x12c21b;
    iVar2 = fstat(iVar1,(stat *)local_118);
    if (iVar2 < 0) {
      piVar8 = __errno_location();
      (*error_callback)(data,"fstat",*piVar8);
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      iVar2 = tcmalloc_backtrace_get_view
                        (state,iVar1,0,st.st_rdev,error_callback,data,
                         (backtrace_view *)(st.__glibc_reserved + 2));
      if (iVar2 != 0) {
        uVar3 = elf_crc32((uint32_t)st.__glibc_reserved[2],(uchar *)st.st_rdev,len);
        tcmalloc_backtrace_release_view
                  (state,(backtrace_view *)(st.__glibc_reserved + 2),error_callback,data);
      }
    }
    if (uVar3 != debuglink_crc) {
      tcmalloc_backtrace_close(iVar1,error_callback,data);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

static int
elf_open_debugfile_by_debuglink (struct backtrace_state *state,
				 const char *filename,
				 const char *debuglink_name,
				 uint32_t debuglink_crc,
				 backtrace_error_callback error_callback,
				 void *data)
{
  int ddescriptor;

  ddescriptor = elf_find_debugfile_by_debuglink (state, filename,
						 debuglink_name,
						 error_callback, data);
  if (ddescriptor < 0)
    return -1;

  if (debuglink_crc != 0)
    {
      uint32_t got_crc;

      got_crc = elf_crc32_file (state, ddescriptor, error_callback, data);
      if (got_crc != debuglink_crc)
	{
	  backtrace_close (ddescriptor, error_callback, data);
	  return -1;
	}
    }

  return ddescriptor;
}